

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

uint ncnn::get_elf_hwcap(uint type)

{
  int iVar1;
  anon_struct_8_2_05f151bc in_RAX;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  anon_struct_8_2_05f151bc entry;
  
  entry = in_RAX;
  __stream = fopen("/proc/self/auxv","rb");
  if (__stream == (FILE *)0x0) {
    fwrite("fopen /proc/self/auxv failed",0x1c,1,_stderr);
    fputc(10,_stderr);
    uVar3 = 0;
  }
  else {
    while ((iVar1 = feof(__stream), uVar3 = 0, iVar1 == 0 &&
           (sVar2 = fread(&entry,8,1,__stream), uVar3 = 0, (int)sVar2 == 1))) {
      if ((entry.tag == 0 && entry.value == 0) || (uVar3 = entry.value, entry.tag == type)) break;
    }
    fclose(__stream);
  }
  return uVar3;
}

Assistant:

static unsigned int get_elf_hwcap(unsigned int type)
{
#if defined __ANDROID__
    unsigned int hwcap = get_elf_hwcap_from_getauxval(type);
    if (hwcap)
        return hwcap;
#endif

    return get_elf_hwcap_from_proc_self_auxv(type);
}